

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O1

void __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test::testBody
          (TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test *this)

{
  UtestShell *pUVar1;
  MockNamedValueCopier *pMVar2;
  TestTerminator *pTVar3;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallCopier copier3;
  TypeForTestingExpectedFunctionCallCopier copier2;
  TypeForTestingExpectedFunctionCallCopier copier1;
  SimpleString local_48;
  MockNamedValueComparatorsAndCopiersRepository local_38;
  MockNamedValueCopier local_28;
  MockNamedValueCopier local_20;
  MockNamedValueCopier local_18;
  
  local_18._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002b7938;
  local_20._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002b7938;
  local_28._vptr_MockNamedValueCopier = (_func_int **)&PTR__MockNamedValueCopier_002b7938;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&local_38);
  SimpleString::SimpleString(&local_48,"type1");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_38,&local_48,&local_18);
  SimpleString::~SimpleString(&local_48);
  SimpleString::SimpleString(&local_48,"type2");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_38,&local_48,&local_20);
  SimpleString::~SimpleString(&local_48);
  SimpleString::SimpleString(&local_48,"type3");
  MockNamedValueComparatorsAndCopiersRepository::installCopier(&local_38,&local_48,&local_28);
  SimpleString::~SimpleString(&local_48);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"type3");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_38,&local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_28,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x82,pTVar3);
  SimpleString::~SimpleString(&local_48);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"type2");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_38,&local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_20,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x83,pTVar3);
  SimpleString::~SimpleString(&local_48);
  pUVar1 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_48,"type1");
  pMVar2 = MockNamedValueComparatorsAndCopiersRepository::getCopierForType(&local_38,&local_48);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,&local_18,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x84,pTVar3);
  SimpleString::~SimpleString(&local_48);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&local_38);
  return;
}

Assistant:

virtual void copy(void* dst_, const void* src_) _override
    {
        TypeForTestingExpectedFunctionCall* dst = (TypeForTestingExpectedFunctionCall*) dst_;
        const TypeForTestingExpectedFunctionCall* src = (const TypeForTestingExpectedFunctionCall*) src_;
        *(dst->value) = *(src->value);
    }